

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenMemoryCopy(BinaryenModuleRef module,BinaryenExpressionRef dest,BinaryenExpressionRef source,
                  BinaryenExpressionRef size,char *destMemory,char *sourceMemory)

{
  MemoryCopy *this;
  string_view sVar1;
  string_view sVar2;
  
  sVar1 = (string_view)getMemoryName(module,destMemory);
  sVar2 = (string_view)getMemoryName(module,sourceMemory);
  this = (MemoryCopy *)MixedArena::allocSpace(&module->allocator,0x48,8);
  *(undefined8 *)&(this->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression = 0;
  (this->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id = 0;
  this->size = (Expression *)0x0;
  (this->destMemory).super_IString.str._M_len = 0;
  (this->destMemory).super_IString.str._M_str = (char *)0x0;
  (this->sourceMemory).super_IString.str._M_len = 0;
  (this->sourceMemory).super_IString.str._M_str = (char *)0x0;
  this->dest = (Expression *)0x0;
  this->source = (Expression *)0x0;
  (this->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression._id = MemoryCopyId;
  (this->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id = 0;
  (this->destMemory).super_IString.str._M_len = 0;
  (this->destMemory).super_IString.str._M_str = (char *)0x0;
  (this->sourceMemory).super_IString.str._M_len = 0;
  (this->sourceMemory).super_IString.str._M_str = (char *)0x0;
  this->dest = dest;
  this->source = source;
  this->size = size;
  (this->destMemory).super_IString.str = sVar1;
  (this->sourceMemory).super_IString.str = sVar2;
  wasm::MemoryCopy::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenMemoryCopy(BinaryenModuleRef module,
                                         BinaryenExpressionRef dest,
                                         BinaryenExpressionRef source,
                                         BinaryenExpressionRef size,
                                         const char* destMemory,
                                         const char* sourceMemory) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeMemoryCopy((Expression*)dest,
                      (Expression*)source,
                      (Expression*)size,
                      getMemoryName(module, destMemory),
                      getMemoryName(module, sourceMemory)));
}